

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Result * __thiscall Catch::Clara::Opt::validate(Result *__return_storage_ptr__,Opt *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  pointer pSVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  pSVar3 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar3 == pSVar2) {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"No options supplied to Opt","");
    (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = LogicError;
    (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
         (_func_int **)&PTR__BasicResult_001b25c0;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (local_40 == &local_30) {
      paVar1->_M_allocated_capacity = local_30;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_28;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_40;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_30;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = local_38;
  }
  else {
    bVar6 = false;
    do {
      if (pSVar3->m_size == 0) {
        pcVar5 = "Option name cannot be empty";
        pcVar4 = "";
LAB_0014418a:
        local_40 = &local_30;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar5,pcVar4);
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = LogicError;
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
             (_func_int **)&PTR__BasicResult_001b25c0;
        paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if (local_40 == &local_30) {
          paVar1->_M_allocated_capacity = local_30;
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_28;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_40;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_30;
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length = local_38;
        if (!bVar6) {
          return __return_storage_ptr__;
        }
        break;
      }
      if (*pSVar3->m_start != '-') {
        pcVar5 = "Option name must begin with \'-\'";
        pcVar4 = "";
        goto LAB_0014418a;
      }
      pSVar3 = pSVar3 + 1;
      bVar6 = pSVar3 == pSVar2;
    } while (!bVar6);
    (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
    (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
         (_func_int **)&PTR__BasicResult_001b25c0;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::Result Opt::validate() const {
            if (m_optNames.empty())
                return Detail::Result::logicError("No options supplied to Opt");
            for (auto const& name : m_optNames) {
                if (name.empty())
                    return Detail::Result::logicError(
                        "Option name cannot be empty");
#ifdef CATCH_PLATFORM_WINDOWS
                if (name[0] != '-' && name[0] != '/')
                    return Detail::Result::logicError(
                        "Option name must begin with '-' or '/'");
#else
                if (name[0] != '-')
                    return Detail::Result::logicError(
                        "Option name must begin with '-'");
#endif
            }
            return ParserRefImpl::validate();
        }